

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *this_00;
  char cVar1;
  int iVar2;
  pointer pRVar3;
  pointer pCVar4;
  pointer pcVar5;
  BamAlignment *pBVar6;
  bool bVar7;
  byte bVar8;
  ostream *poVar9;
  long lVar10;
  int iVar11;
  size_type sVar12;
  char *pcVar13;
  const_iterator cigarIter;
  pointer pCVar14;
  ulong uVar15;
  ulong uVar16;
  string tagName;
  byte local_61;
  char local_60;
  undefined7 uStack_5f;
  long local_58;
  undefined1 local_50 [16];
  BamAlignment *local_40;
  ulong local_38;
  
  this_00 = &this->m_out;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (this_00,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
  local_60 = '\t';
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_60 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
  iVar2 = a->RefID;
  lVar10 = (long)iVar2;
  if ((lVar10 < 0) ||
     (pRVar3 = (this->m_references).
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
               super__Vector_impl_data._M_start,
     iVar11 = (int)((ulong)((long)(this->m_references).
                                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3),
     SBORROW4(iVar2,iVar11 * -0x33333333) == iVar2 + iVar11 * 0x33333333 < 0)) {
    pcVar13 = "*\t";
    lVar10 = 2;
    poVar9 = this_00;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this_00,pRVar3[lVar10].RefName._M_dataplus._M_p,
                        pRVar3[lVar10].RefName._M_string_length);
    pcVar13 = &local_60;
    local_60 = '\t';
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,lVar10);
  poVar9 = (ostream *)std::ostream::operator<<(this_00,a->Position + 1);
  local_60 = '\t';
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_60 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
  pCVar14 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = a;
  if (pCVar14 == pCVar4) {
    pcVar13 = "*\t";
    lVar10 = 2;
  }
  else {
    do {
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      local_60 = pCVar14->Type;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar4);
    pcVar13 = &local_60;
    local_60 = '\t';
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar13,lVar10);
  pBVar6 = local_40;
  bVar7 = BamAlignment::IsPaired(local_40);
  if (bVar7) {
    iVar2 = pBVar6->MateRefID;
    lVar10 = (long)iVar2;
    if ((lVar10 < 0) ||
       (pRVar3 = (this->m_references).
                 super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                 super__Vector_impl_data._M_start,
       iVar11 = (int)((ulong)((long)(this->m_references).
                                    super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3)
       , SBORROW4(iVar2,iVar11 * -0x33333333) == iVar2 + iVar11 * 0x33333333 < 0))
    goto LAB_001523ee;
    if (iVar2 == pBVar6->RefID) {
      pcVar13 = "=\t";
      lVar10 = 2;
      poVar9 = this_00;
    }
    else {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (this_00,pRVar3[lVar10].RefName._M_dataplus._M_p,
                          pRVar3[lVar10].RefName._M_string_length);
      pcVar13 = &local_60;
      local_60 = '\t';
      lVar10 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,lVar10);
    poVar9 = (ostream *)std::ostream::operator<<(this_00,pBVar6->MatePosition + 1);
    local_60 = '\t';
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_60,1);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,pBVar6->InsertSize);
    local_60 = '\t';
    pcVar13 = &local_60;
    lVar10 = 1;
  }
  else {
LAB_001523ee:
    pcVar13 = "*\t0\t0\t";
    lVar10 = 6;
    poVar9 = this_00;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,lVar10);
  sVar12 = (pBVar6->QueryBases)._M_string_length;
  if (sVar12 == 0) {
    pcVar13 = "*\t";
    lVar10 = 2;
    poVar9 = this_00;
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this_00,(pBVar6->QueryBases)._M_dataplus._M_p,sVar12);
    pcVar13 = &local_60;
    local_60 = '\t';
    lVar10 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,lVar10);
  sVar12 = (pBVar6->Qualities)._M_string_length;
  if ((sVar12 == 0) || (pcVar13 = (pBVar6->Qualities)._M_dataplus._M_p, *pcVar13 == -1)) {
    pcVar13 = &local_60;
    local_60 = '*';
    sVar12 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar13,sVar12);
  pcVar5 = (pBVar6->TagData)._M_dataplus._M_p;
  local_38 = (pBVar6->TagData)._M_string_length;
  uVar15 = 0;
LAB_00152486:
  if (local_38 <= uVar15) goto LAB_00152713;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)&pBVar6->TagData);
  local_61 = 9;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_61,1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)CONCAT71(uStack_5f,local_60),local_58);
  local_61 = 0x3a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_61,1);
  if ((local_40->TagData)._M_string_length <= uVar15 + 2) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
  }
  bVar8 = (pBVar6->TagData)._M_dataplus._M_p[uVar15 + 2];
  uVar16 = uVar15 + 3;
  if (0x59 < bVar8) {
    if (0x65 < bVar8) {
      if (bVar8 == 0x66) {
        std::__ostream_insert<char,std::char_traits<char>>(this_00,"f:",2);
        std::ostream::_M_insert<double>((double)*(float *)(pcVar5 + uVar16));
      }
      else {
        if (bVar8 != 0x69) {
          if (bVar8 == 0x73) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
            std::ostream::operator<<(this_00,*(short *)(pcVar5 + uVar16));
            goto LAB_00152652;
          }
          goto switchD_00152529_caseD_42;
        }
        std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
        std::ostream::operator<<(this_00,*(int *)(pcVar5 + uVar16));
      }
      goto LAB_001526ee;
    }
    if (bVar8 == 0x5a) goto switchD_00152529_caseD_48;
    if (bVar8 != 99) goto switchD_00152529_caseD_42;
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
    std::ostream::operator<<(this_00,(short)pcVar5[uVar16]);
    goto LAB_0015267f;
  }
  switch(bVar8) {
  case 0x41:
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"A:",2);
    local_61 = pcVar5[uVar16];
    std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_61,1);
    goto LAB_0015267f;
  case 0x42:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    goto switchD_00152529_caseD_42;
  case 0x43:
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
LAB_0015267f:
    uVar16 = uVar15 + 4;
    break;
  case 0x48:
switchD_00152529_caseD_48:
    local_61 = bVar8;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_61,1);
    local_61 = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_61,1);
    bVar8 = pcVar5[uVar16];
    while (bVar8 != 0) {
      local_61 = bVar8;
      std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_61,1);
      lVar10 = uVar16 + 1;
      uVar16 = uVar16 + 1;
      bVar8 = pcVar5[lVar10];
    }
    uVar16 = uVar16 + 1;
    goto switchD_00152529_caseD_42;
  case 0x49:
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
LAB_001526ee:
    uVar16 = uVar15 + 7;
    break;
  default:
    if (bVar8 != 0x53) goto switchD_00152529_caseD_42;
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"i:",2);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
LAB_00152652:
    uVar16 = uVar15 + 5;
  }
LAB_001526f2:
  cVar1 = pcVar5[uVar16];
  if ((undefined1 *)CONCAT71(uStack_5f,local_60) != local_50) {
    operator_delete((undefined1 *)CONCAT71(uStack_5f,local_60));
  }
  uVar15 = uVar16;
  if (cVar1 == '\0') {
LAB_00152713:
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    return;
  }
  goto LAB_00152486;
switchD_00152529_caseD_42:
  goto LAB_001526f2;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size()))
        m_out << m_references[a.RefID].RefName << '\t';
    else
        m_out << "*\t";

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty())
        m_out << "*\t";
    else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID)
            m_out << "=\t";
        else
            m_out << m_references[a.MateRefID].RefName << '\t';
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else
        m_out << "*\t0\t0\t";

    // write sequence
    if (a.QueryBases.empty())
        m_out << "*\t";
    else
        m_out << a.QueryBases << '\t';

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF))
        m_out << '*';
    else
        m_out << a.Qualities;

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<int16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<uint16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;
        }

        if (tagData[index] == '\0') break;
    }

    m_out << std::endl;
}